

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

QSizeF __thiscall QGraphicsWidget::sizeHint(QGraphicsWidget *this,SizeHint which,QSizeF *constraint)

{
  QSizeF QVar1;
  bool bVar2;
  QGraphicsWidgetPrivate *pQVar3;
  pointer pQVar4;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar5;
  qreal qVar6;
  double w;
  QGraphicsWidgetPrivate *d;
  QSizeF marginSize;
  QSizeF sh;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QMessageLogger *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  SizeHint which_00;
  QGraphicsLayoutItem *in_stack_ffffffffffffff28;
  char local_a8 [32];
  QSizeF local_88;
  QSizeF local_78;
  QSizeF local_68;
  QSizeF local_58;
  QSizeF local_48;
  QSizeF local_38;
  QSizeF local_28;
  QSizeF local_18;
  long local_8;
  
  which_00 = (SizeHint)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsWidget *)0xa4c664);
  local_18.wd = -NAN;
  local_18.ht = -NAN;
  QSizeF::QSizeF(&local_18);
  if (pQVar3->layout == (QGraphicsLayout *)0x0) {
    if (in_ESI == 0) {
      QSizeF::QSizeF(&local_68,0.0,0.0);
      local_18.wd = local_68.wd;
      local_18.ht = local_68.ht;
    }
    else if (in_ESI == 1) {
      QSizeF::QSizeF(&local_78,50.0,50.0);
      local_18.wd = local_78.wd;
      local_18.ht = local_78.ht;
    }
    else if (in_ESI == 2) {
      QSizeF::QSizeF(&local_88,16777215.0,16777215.0);
      local_18.wd = local_88.wd;
      local_18.ht = local_88.ht;
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff10,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
      QMessageLogger::warning
                (local_a8,
                 "QGraphicsWidget::sizeHint(): Don\'t know how to handle the value of \'which\'");
    }
  }
  else {
    local_28.wd = -NAN;
    local_28.ht = -NAN;
    QSizeF::QSizeF(&local_28,0.0,0.0);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c6e9);
    if (bVar2) {
      pQVar4 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                         ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c703);
      qVar5 = QMarginsF::left(pQVar4);
      pQVar4 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                         ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c722);
      qVar6 = QMarginsF::right(pQVar4);
      w = qVar5 + qVar6;
      pQVar4 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                         ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c74e);
      which_00 = (SizeHint)((ulong)qVar5 >> 0x20);
      in_stack_ffffffffffffff28 = (QGraphicsLayoutItem *)QMarginsF::top(pQVar4);
      pQVar4 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                         ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c76d);
      qVar5 = QMarginsF::bottom(pQVar4);
      QSizeF::QSizeF(&local_38,w,(double)in_stack_ffffffffffffff28 + qVar5);
      local_28.wd = local_38.wd;
      local_28.ht = local_38.ht;
    }
    local_58 = ::operator-((QSizeF *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (QSizeF *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_48 = QGraphicsLayoutItem::effectiveSizeHint
                         (in_stack_ffffffffffffff28,which_00,
                          (QSizeF *)CONCAT44(in_ESI,in_stack_ffffffffffffff18));
    local_18.wd = local_48.wd;
    local_18.ht = local_48.ht;
    QSizeF::operator+=(&local_18,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.ht._0_4_ = SUB84(local_18.ht,0);
  QVar1.wd = local_18.wd;
  QVar1.ht._4_4_ = (int)((ulong)local_18.ht >> 0x20);
  return QVar1;
}

Assistant:

QSizeF QGraphicsWidget::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_D(const QGraphicsWidget);
    QSizeF sh;
    if (d->layout) {
        QSizeF marginSize(0,0);
        if (d->margins) {
            marginSize = QSizeF(d->margins->left() + d->margins->right(),
                         d->margins->top() + d->margins->bottom());
        }
        sh = d->layout->effectiveSizeHint(which, constraint - marginSize);
        sh += marginSize;
    } else {
        switch (which) {
            case Qt::MinimumSize:
                sh = QSizeF(0, 0);
                break;
            case Qt::PreferredSize:
                sh = QSizeF(50, 50);    //rather arbitrary
                break;
            case Qt::MaximumSize:
                sh = QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
                break;
            default:
                qWarning("QGraphicsWidget::sizeHint(): Don't know how to handle the value of 'which'");
                break;
        }
    }
    return sh;
}